

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

int Abc_NtkFunctionalIsoGia_rec(Gia_Man_t *pNew,Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (((iVar1 == 0) && ((pNode->vFanins).nSize != 0)) &&
     (uVar2 = *(uint *)&pNode->field_0x14 & 0xf, uVar2 != 2)) {
    if (uVar2 == 7) {
      Abc_NodeSetTravIdCurrent(pNode);
      iVar1 = Abc_NtkFunctionalIsoGia_rec
                        (pNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]);
      iVar3 = Abc_NtkFunctionalIsoGia_rec
                        (pNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]);
      iVar1 = Abc_LitNotCond(iVar1,*(uint *)&pNode->field_0x14 >> 10 & 1);
      iVar3 = Abc_LitNotCond(iVar3,*(uint *)&pNode->field_0x14 >> 0xb & 1);
      iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar3);
      (pNode->field_6).iTemp = iVar1;
      return iVar1;
    }
    if (uVar2 != 5) {
      __assert_fail("Abc_ObjIsNode( pNode )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                    ,0x3cf,"int Abc_NtkFunctionalIsoGia_rec(Gia_Man_t *, Abc_Obj_t *)");
    }
  }
  return (pNode->field_6).iTemp;
}

Assistant:

int Abc_NtkFunctionalIsoGia_rec( Gia_Man_t * pNew, Abc_Obj_t * pNode )
{
    int iLit0, iLit1;
    if ( Abc_NodeIsTravIdCurrent(pNode) || Abc_ObjFaninNum(pNode) == 0 || Abc_ObjIsCi(pNode) )
        return pNode->iTemp;
    assert( Abc_ObjIsNode( pNode ) );
    Abc_NodeSetTravIdCurrent( pNode );
    iLit0 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pNode) );
    iLit1 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin1(pNode) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_ObjFaninC0(pNode) );
    iLit1 = Abc_LitNotCond( iLit1, Abc_ObjFaninC1(pNode) );
    return (pNode->iTemp = Gia_ManHashAnd(pNew, iLit0, iLit1));
}